

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damagebintobin.cpp
# Opt level: O0

void DoIt(bool validationCheck)

{
  undefined1 local_3034 [8];
  ValidateDamageBin vDBD;
  bool validationCheck_local;
  
  vDBD.prevLine_[0xffb] = validationCheck;
  ValidateDamageBin::ValidateDamageBin((ValidateDamageBin *)local_3034);
  Validate::SkipHeaderRow((Validate *)local_3034);
  if ((vDBD.prevLine_[0xffb] & 1U) == 0) {
    ValidateDamageBin::ReadDamageBinDictFileNoChecks((ValidateDamageBin *)local_3034);
  }
  else {
    ValidateDamageBin::CheckFormat((ValidateDamageBin *)local_3034);
    ValidateDamageBin::CheckFirstBin((ValidateDamageBin *)local_3034,true);
    ValidateDamageBin::ReadDamageBinDictFile((ValidateDamageBin *)local_3034,true);
    ValidateDamageBin::CheckLastBin((ValidateDamageBin *)local_3034);
    Validate::PrintSuccessMessage((Validate *)local_3034);
  }
  ValidateDamageBin::~ValidateDamageBin((ValidateDamageBin *)local_3034);
  return;
}

Assistant:

void DoIt(const bool validationCheck) {

  ValidateDamageBin vDBD;
  vDBD.SkipHeaderRow();

  if (validationCheck) {

    vDBD.CheckFormat();
    vDBD.CheckFirstBin(true);   // true = convert to binary
    vDBD.ReadDamageBinDictFile(true);   // true = convert to binary
    vDBD.CheckLastBin();
    vDBD.PrintSuccessMessage();

    return;

  }

  vDBD.ReadDamageBinDictFileNoChecks();

}